

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# busyindicator.cpp
# Opt level: O0

int __thiscall QtMWidgets::BusyIndicatorPrivate::init(BusyIndicatorPrivate *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  QVariantAnimation *pQVar2;
  QPalette *this_00;
  QColor *pQVar3;
  Object local_68 [8];
  QVariant local_60;
  QVariant local_40;
  BusyIndicatorPrivate *local_10;
  BusyIndicatorPrivate *this_local;
  
  local_10 = this;
  pQVar2 = (QVariantAnimation *)operator_new(0x10);
  QVariantAnimation::QVariantAnimation(pQVar2,(QObject *)this->q);
  this->animation = pQVar2;
  pQVar2 = this->animation;
  QVariant::QVariant(&local_40,0.0);
  QVariantAnimation::setStartValue((QVariant *)pQVar2);
  QVariant::~QVariant(&local_40);
  pQVar2 = this->animation;
  QVariant::QVariant(&local_60,359.0);
  QVariantAnimation::setEndValue((QVariant *)pQVar2);
  QVariant::~QVariant(&local_60);
  QVariantAnimation::setDuration((int)this->animation);
  QAbstractAnimation::setLoopCount((int)this->animation);
  QObject::
  connect<void(QVariantAnimation::*)(QVariant_const&),void(QtMWidgets::BusyIndicator::*)(QVariant_const&)>
            (local_68,(offset_in_QVariantAnimation_to_subr)this->animation,
             (Object *)QVariantAnimation::valueChanged,0,(ConnectionType)this->q);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  this_00 = (QPalette *)QWidget::palette();
  pQVar3 = QPalette::color(this_00,Highlight);
  *(undefined8 *)&this->color = *(undefined8 *)pQVar3;
  *(undefined4 *)((long)&(this->color).ct + 4) = *(undefined4 *)((long)&pQVar3->ct + 4);
  (this->color).ct.argb.pad = (pQVar3->ct).argb.pad;
  iVar1 = QAbstractAnimation::start(this->animation,0);
  return iVar1;
}

Assistant:

void
BusyIndicatorPrivate::init()
{
	animation = new QVariantAnimation( q );
	animation->setStartValue( 0.0 );
	animation->setEndValue( 359.0 );
	animation->setDuration( 1000 );
	animation->setLoopCount( -1 );

	QObject::connect( animation, &QVariantAnimation::valueChanged,
		q, &BusyIndicator::_q_update );

	color = q->palette().color( QPalette::Highlight );

	animation->start();
}